

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3RenameExprlistUnmap(Parse *pParse,ExprList *pEList)

{
  int iVar1;
  long lVar2;
  RenameToken *pRVar3;
  Walker sWalker;
  Walker local_48;
  
  if (pEList != (ExprList *)0x0) {
    local_48.walkerDepth = 0;
    local_48.eCode = 0;
    local_48.mWFlags = 0;
    local_48.u.pNC = (NameContext *)0x0;
    local_48.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
    local_48.xSelectCallback2 = (_func_void_Walker_ptr_Select_ptr *)0x0;
    local_48.xExprCallback = renameUnmapExprCb;
    local_48.pParse = pParse;
    sqlite3WalkExprList(&local_48,pEList);
    iVar1 = pEList->nExpr;
    if (0 < (long)iVar1) {
      lVar2 = 0;
      do {
        if (((pEList->a[lVar2].fg.field_0x1 & 3) == 0) &&
           (pRVar3 = pParse->pRename, pRVar3 != (RenameToken *)0x0)) {
          do {
            if ((char *)pRVar3->p == pEList->a[lVar2].zEName) {
              pRVar3->p = (void *)0x0;
              break;
            }
            pRVar3 = pRVar3->pNext;
          } while (pRVar3 != (RenameToken *)0x0);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 != iVar1);
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameExprlistUnmap(Parse *pParse, ExprList *pEList){
  if( pEList ){
    int i;
    Walker sWalker;
    memset(&sWalker, 0, sizeof(Walker));
    sWalker.pParse = pParse;
    sWalker.xExprCallback = renameUnmapExprCb;
    sqlite3WalkExprList(&sWalker, pEList);
    for(i=0; i<pEList->nExpr; i++){
      if( ALWAYS(pEList->a[i].fg.eEName==ENAME_NAME) ){
        sqlite3RenameTokenRemap(pParse, 0, (void*)pEList->a[i].zEName);
      }
    }
  }
}